

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O1

int x86cpuid_GetFirm(Cx86cpuid *p)

{
  bool bVar1;
  ulong in_RAX;
  UInt32 *pUVar2;
  ulong uVar3;
  
  pUVar2 = kVendors[0] + 2;
  uVar3 = 0;
  while( true ) {
    bVar1 = true;
    if ((((*(UInt32 (*) [3])(pUVar2 + -2))[0] == p->vendor[0]) && (pUVar2[-1] == p->vendor[1])) &&
       (*pUVar2 == p->vendor[2])) {
      bVar1 = false;
      in_RAX = uVar3 & 0xffffffff;
    }
    if (!bVar1) break;
    uVar3 = uVar3 + 1;
    pUVar2 = pUVar2 + 3;
    if (uVar3 == 3) {
      return -1;
    }
  }
  return (int)in_RAX;
}

Assistant:

int x86cpuid_GetFirm(const Cx86cpuid *p)
{
  unsigned i;
  for (i = 0; i < sizeof(kVendors) / sizeof(kVendors[i]); i++)
  {
    const UInt32 *v = kVendors[i];
    if (v[0] == p->vendor[0] &&
        v[1] == p->vendor[1] &&
        v[2] == p->vendor[2])
      return (int)i;
  }
  return -1;
}